

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_rescale_enc.c
# Opt level: O3

int WebPPictureRescale(WebPPicture *pic,int width,int height)

{
  int iVar1;
  int iVar2;
  rescaler_t *work;
  int iVar3;
  int width_local;
  int height_local;
  WebPPicture tmp;
  
  if (pic == (WebPPicture *)0x0) {
    return 0;
  }
  iVar2 = pic->width;
  iVar3 = pic->height;
  width_local = width;
  height_local = height;
  iVar1 = WebPRescalerGetScaledDimensions(iVar2,iVar3,&width_local,&height_local);
  if (iVar1 == 0) {
    return 0;
  }
  memcpy(&tmp,pic,0x100);
  WebPPictureResetBuffers(&tmp);
  tmp.width = width_local;
  tmp.height = height_local;
  iVar1 = WebPPictureAlloc(&tmp);
  if (iVar1 == 0) {
    return 0;
  }
  if (pic->use_argb == 0) {
    work = (rescaler_t *)WebPSafeMalloc((long)width_local * 2,4);
    if (work == (rescaler_t *)0x0) goto LAB_0012f174;
    if (pic->a != (uint8_t *)0x0) {
      WebPInitAlphaProcessing();
      iVar1 = RescalePlane(pic->a,iVar2,iVar3,pic->a_stride,tmp.a,width_local,height_local,
                           tmp.a_stride,work,1);
      if (iVar1 == 0) {
        return 0;
      }
    }
    AlphaMultiplyY(pic,0);
    iVar1 = RescalePlane(pic->y,iVar2,iVar3,pic->y_stride,tmp.y,width_local,height_local,
                         tmp.y_stride,work,1);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = iVar2 + 1 >> 1;
    iVar3 = iVar3 + 1 >> 1;
    iVar2 = RescalePlane(pic->u,iVar1,iVar3,pic->uv_stride,tmp.u,width_local + 1 >> 1,
                         height_local + 1 >> 1,tmp.uv_stride,work,1);
    if (iVar2 == 0) {
      return 0;
    }
    iVar2 = RescalePlane(pic->v,iVar1,iVar3,pic->uv_stride,tmp.v,width_local + 1 >> 1,
                         height_local + 1 >> 1,tmp.uv_stride,work,1);
    if (iVar2 == 0) {
      return 0;
    }
    if (tmp.a != (uint8_t *)0x0) {
      WebPMultRows(tmp.y,tmp.y_stride,tmp.a,tmp.a_stride,tmp.width,tmp.height,1);
    }
  }
  else {
    work = (rescaler_t *)WebPSafeMalloc((long)width_local << 3,4);
    if (work == (rescaler_t *)0x0) {
LAB_0012f174:
      WebPPictureFree(&tmp);
      return 0;
    }
    WebPInitAlphaProcessing();
    WebPMultARGBRows((uint8_t *)pic->argb,pic->argb_stride << 2,pic->width,pic->height,0);
    iVar2 = RescalePlane((uint8_t *)pic->argb,iVar2,iVar3,pic->argb_stride << 2,(uint8_t *)tmp.argb,
                         width_local,height_local,tmp.argb_stride << 2,work,4);
    if (iVar2 == 0) {
      return 0;
    }
    WebPMultARGBRows((uint8_t *)tmp.argb,tmp.argb_stride << 2,tmp.width,tmp.height,1);
  }
  WebPPictureFree(pic);
  WebPSafeFree(work);
  memcpy(pic,&tmp,0x100);
  return 1;
}

Assistant:

int WebPPictureRescale(WebPPicture* pic, int width, int height) {
  WebPPicture tmp;
  int prev_width, prev_height;
  rescaler_t* work;

  if (pic == NULL) return 0;
  prev_width = pic->width;
  prev_height = pic->height;
  if (!WebPRescalerGetScaledDimensions(
          prev_width, prev_height, &width, &height)) {
    return 0;
  }

  PictureGrabSpecs(pic, &tmp);
  tmp.width = width;
  tmp.height = height;
  if (!WebPPictureAlloc(&tmp)) return 0;

  if (!pic->use_argb) {
    work = (rescaler_t*)WebPSafeMalloc(2ULL * width, sizeof(*work));
    if (work == NULL) {
      WebPPictureFree(&tmp);
      return 0;
    }
    // If present, we need to rescale alpha first (for AlphaMultiplyY).
    if (pic->a != NULL) {
      WebPInitAlphaProcessing();
      if (!RescalePlane(pic->a, prev_width, prev_height, pic->a_stride,
                        tmp.a, width, height, tmp.a_stride, work, 1)) {
        return 0;
      }
    }

    // We take transparency into account on the luma plane only. That's not
    // totally exact blending, but still is a good approximation.
    AlphaMultiplyY(pic, 0);
    if (!RescalePlane(pic->y, prev_width, prev_height, pic->y_stride,
                      tmp.y, width, height, tmp.y_stride, work, 1) ||
        !RescalePlane(pic->u,
                      HALVE(prev_width), HALVE(prev_height), pic->uv_stride,
                      tmp.u,
                      HALVE(width), HALVE(height), tmp.uv_stride, work, 1) ||
        !RescalePlane(pic->v,
                      HALVE(prev_width), HALVE(prev_height), pic->uv_stride,
                      tmp.v,
                      HALVE(width), HALVE(height), tmp.uv_stride, work, 1)) {
      return 0;
    }
    AlphaMultiplyY(&tmp, 1);
  } else {
    work = (rescaler_t*)WebPSafeMalloc(2ULL * width * 4, sizeof(*work));
    if (work == NULL) {
      WebPPictureFree(&tmp);
      return 0;
    }
    // In order to correctly interpolate colors, we need to apply the alpha
    // weighting first (black-matting), scale the RGB values, and remove
    // the premultiplication afterward (while preserving the alpha channel).
    WebPInitAlphaProcessing();
    AlphaMultiplyARGB(pic, 0);
    if (!RescalePlane((const uint8_t*)pic->argb, prev_width, prev_height,
                      pic->argb_stride * 4,
                      (uint8_t*)tmp.argb, width, height,
                      tmp.argb_stride * 4, work, 4)) {
      return 0;
    }
    AlphaMultiplyARGB(&tmp, 1);
  }
  WebPPictureFree(pic);
  WebPSafeFree(work);
  *pic = tmp;
  return 1;
}